

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fec.cpp
# Opt level: O2

int __thiscall DSDcc::Golay_20_8::init(Golay_20_8 *this,EVP_PKEY_CTX *ctx)

{
  int syndromeI;
  undefined1 *puVar1;
  byte bVar2;
  uchar uVar3;
  int iVar4;
  uchar uVar5;
  uint uVar6;
  long lVar7;
  long lVar8;
  uint uVar9;
  undefined1 *puVar10;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  uint uVar15;
  uint uVar16;
  ulong uVar17;
  uint uVar18;
  uchar uVar19;
  long lVar20;
  uint uVar21;
  long lVar22;
  uchar uVar23;
  uint uVar24;
  undefined1 *puVar25;
  undefined1 *puVar26;
  uint uVar27;
  undefined1 *puVar28;
  undefined1 *puVar29;
  
  memset(this,0xff,0x3000);
  puVar1 = &m_H;
  puVar29 = &DAT_00128542;
  puVar26 = &DAT_00128541;
  uVar17 = 2;
  lVar22 = 1;
  for (lVar20 = 0; uVar12 = uVar17, lVar8 = lVar22, puVar25 = puVar26, puVar28 = puVar29,
      lVar20 != 8; lVar20 = lVar20 + 1) {
    for (; uVar19 = (uchar)lVar20, puVar10 = puVar28, uVar11 = uVar12, lVar8 != 8; lVar8 = lVar8 + 1
        ) {
      while( true ) {
        lVar7 = 0;
        bVar2 = 0xb;
        uVar23 = (uchar)lVar8;
        if (7 < uVar11) break;
        uVar14 = 0;
        for (; lVar7 != 0xf0; lVar7 = lVar7 + 0x14) {
          uVar14 = (ulong)((int)uVar14 +
                          (((uint)(byte)puVar10[lVar7] +
                            (uint)(byte)puVar25[lVar7] + (uint)(byte)puVar1[lVar7] & 1) <<
                          (bVar2 & 0x1f)));
          bVar2 = bVar2 - 1;
        }
        this->m_corr[uVar14][0] = uVar19;
        this->m_corr[uVar14][1] = uVar23;
        this->m_corr[uVar14][2] = (uchar)uVar11;
        puVar10 = puVar10 + 1;
        uVar11 = uVar11 + 1;
      }
      uVar11 = 0;
      for (; lVar7 != 0xf0; lVar7 = lVar7 + 0x14) {
        uVar11 = (ulong)((uint)uVar11 +
                        (((uint)(byte)puVar25[lVar7] + (uint)(byte)puVar1[lVar7] & 1) <<
                        (bVar2 & 0x1f)));
        bVar2 = bVar2 - 1;
      }
      this->m_corr[uVar11][0] = uVar19;
      this->m_corr[uVar11][1] = uVar23;
      uVar3 = '\b';
      for (uVar6 = 0xb; uVar6 != 0xffffffff; uVar6 = uVar6 - 1) {
        uVar13 = (uint)uVar11 ^ 1 << (uVar6 & 0x1f);
        this->m_corr[uVar13][0] = uVar19;
        this->m_corr[uVar13][1] = uVar23;
        this->m_corr[uVar13][2] = uVar3;
        uVar3 = uVar3 + '\x01';
      }
      uVar12 = uVar12 + 1;
      puVar25 = puVar25 + 1;
      puVar28 = puVar28 + 1;
    }
    uVar12 = 0;
    bVar2 = 0xb;
    for (lVar8 = -0xf0; lVar8 != 0; lVar8 = lVar8 + 0x14) {
      uVar12 = (ulong)((uint)uVar12 + ((uint)(byte)puVar1[lVar8 + 0xf0] << (bVar2 & 0x1f)));
      bVar2 = bVar2 - 1;
    }
    this->m_corr[uVar12][0] = uVar19;
    iVar4 = 0;
    uVar23 = '\t';
    uVar6 = 10;
    while (iVar4 != 0xc) {
      uVar15 = (uint)uVar12 ^ 1 << ((byte)(0xb - (char)iVar4) & 0x1f);
      this->m_corr[uVar15][0] = uVar19;
      uVar5 = (char)iVar4 + '\b';
      this->m_corr[uVar15][1] = uVar5;
      iVar4 = iVar4 + 1;
      uVar3 = uVar23;
      for (uVar13 = uVar6; uVar13 != 0xffffffff; uVar13 = uVar13 - 1) {
        uVar18 = uVar15 ^ 1 << (uVar13 & 0x1f);
        this->m_corr[uVar18][0] = uVar19;
        this->m_corr[uVar18][1] = uVar5;
        this->m_corr[uVar18][2] = uVar3;
        uVar3 = uVar3 + '\x01';
      }
      uVar6 = uVar6 - 1;
      uVar23 = uVar23 + '\x01';
    }
    uVar17 = uVar17 + 1;
    lVar22 = lVar22 + 1;
    puVar29 = puVar29 + 1;
    puVar26 = puVar26 + 1;
    puVar1 = puVar1 + 1;
  }
  uVar13 = 0;
  uVar6 = 9;
  while (uVar13 != 0xc) {
    uVar16 = 1 << (0xbU - (char)uVar13 & 0x1f);
    uVar19 = (char)uVar13 + '\b';
    this->m_corr[uVar16][0] = uVar19;
    uVar13 = uVar13 + 1;
    uVar15 = uVar13;
    uVar18 = uVar6;
    while (uVar15 != 0xc) {
      uVar21 = uVar16 ^ 1 << ((byte)(0xb - (char)uVar15) & 0x1f);
      this->m_corr[uVar21][0] = uVar19;
      uVar23 = (char)uVar15 + '\b';
      this->m_corr[uVar21][1] = uVar23;
      uVar15 = uVar15 + 1;
      uVar9 = uVar18;
      for (uVar24 = uVar15; uVar24 < 0xc; uVar24 = uVar24 + 1) {
        uVar27 = uVar21 ^ 1 << (uVar9 & 0x1f);
        this->m_corr[uVar27][0] = uVar19;
        this->m_corr[uVar27][1] = uVar23;
        this->m_corr[uVar27][2] = (char)uVar24 + '\b';
        uVar9 = uVar9 - 1;
      }
      uVar18 = uVar18 - 1;
    }
    uVar6 = uVar6 - 1;
  }
  return uVar13;
}

Assistant:

void Golay_20_8::init()
{
    memset (m_corr, 0xFF, 3*4096);

    for (int i1 = 0; i1 < 8; i1++)
    {
        for (int i2 = i1+1; i2 < 8; i2++)
        {
            for (int i3 = i2+1; i3 < 8; i3++)
            {
                // 3 bit patterns
                int syndromeI = 0;

                for (int ir = 0; ir < 12; ir++)
                {
                    syndromeI += ((m_H[20*ir + i1] +  m_H[20*ir + i2] +  m_H[20*ir + i3]) % 2) << (11-ir);
                }

                m_corr[syndromeI][0] = i1;
                m_corr[syndromeI][1] = i2;
                m_corr[syndromeI][2] = i3;
            }

            // 2 bit patterns
            int syndromeI = 0;

            for (int ir = 0; ir < 12; ir++)
            {
                syndromeI += ((m_H[20*ir + i1] +  m_H[20*ir + i2]) % 2) << (11-ir);
            }

            m_corr[syndromeI][0] = i1;
            m_corr[syndromeI][1] = i2;

            // 1 possible bit flip left in the parity part
            for (int ip = 0; ip < 12; ip++)
            {
                int syndromeIP = syndromeI ^ (1 << (11-ip));
                m_corr[syndromeIP][0] = i1;
                m_corr[syndromeIP][1] = i2;
                m_corr[syndromeIP][2] = 8 + ip;
            }
        }

        // single bit patterns
        int syndromeI = 0;

        for (int ir = 0; ir < 12; ir++)
        {
            syndromeI += m_H[20*ir + i1] << (11-ir);

        }

        m_corr[syndromeI][0] = i1;

        for (int ip1 = 0; ip1 < 12; ip1++) // 1 more bit flip in parity
        {
            int syndromeIP1 = syndromeI ^ (1 << (11-ip1));
            m_corr[syndromeIP1][0] = i1;
            m_corr[syndromeIP1][1] = 8 + ip1;

            for (int ip2 = ip1+1; ip2 < 12; ip2++) // 1 more bit flip in parity
            {
                int syndromeIP2 = syndromeIP1 ^ (1 << (11-ip2));
                m_corr[syndromeIP2][0] = i1;
                m_corr[syndromeIP2][1] = 8 + ip1;
                m_corr[syndromeIP2][2] = 8 + ip2;
            }
        }
    }

    // no bit patterns (in message) -> all in parity
    for (int ip1 = 0; ip1 < 12; ip1++) // 1 bit flip in parity
    {
        int syndromeIP1 =  (1 << (11-ip1));
        m_corr[syndromeIP1][0] = 8 + ip1;

        for (int ip2 = ip1+1; ip2 < 12; ip2++) // 1 more bit flip in parity
        {
            int syndromeIP2 = syndromeIP1 ^ (1 << (11-ip2));
            m_corr[syndromeIP2][0] = 8 + ip1;
            m_corr[syndromeIP2][1] = 8 + ip2;

            for (int ip3 = ip2+1; ip3 < 12; ip3++) // 1 more bit flip in parity
            {
                int syndromeIP3 = syndromeIP2 ^ (1 << (11-ip3));
                m_corr[syndromeIP3][0] = 8 + ip1;
                m_corr[syndromeIP3][1] = 8 + ip2;
                m_corr[syndromeIP3][2] = 8 + ip3;
            }
        }
    }
}